

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering::IfcSurfaceStyleRendering
          (IfcSurfaceStyleRendering *this)

{
  *(undefined8 *)&this->field_0xf0 = 0;
  *(char **)&this->field_0xf8 = "IfcSurfaceStyleRendering";
  (this->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(this->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x10 = 0;
  *(undefined8 *)
   &(this->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x20 = 0;
  (this->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9ae3b8;
  *(undefined8 *)&this->field_0xe8 = 0x9ae408;
  *(undefined8 *)
   &(this->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18 = 0x9ae3e0;
  this->field_0x30 = 0;
  (this->DiffuseColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->DiffuseColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->DiffuseColour).have = false;
  (this->TransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->TransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->TransmissionColour).have = false;
  (this->DiffuseTransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->DiffuseTransmissionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->DiffuseTransmissionColour).have = false;
  (this->ReflectionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ReflectionColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ReflectionColour).have = false;
  (this->SpecularColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SpecularColour).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->SpecularColour).have = false;
  (this->SpecularHighlight).have = false;
  (this->SpecularHighlight).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SpecularHighlight).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ReflectanceMethod)._M_dataplus._M_p = (pointer)&(this->ReflectanceMethod).field_2;
  (this->ReflectanceMethod)._M_string_length = 0;
  (this->ReflectanceMethod).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcSurfaceStyleRendering() : Object("IfcSurfaceStyleRendering") {}